

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  char cVar3;
  bool bVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  int iVar7;
  char *pcVar8;
  long *local_5b0;
  long *local_5a8;
  iterator converter;
  uint *local_598;
  undefined8 local_590;
  uint local_588 [2];
  undefined4 uStack_580;
  undefined4 uStack_57c;
  uint *local_578;
  undefined8 local_570;
  uint local_568 [2];
  undefined4 uStack_560;
  undefined4 uStack_55c;
  uint *local_558;
  undefined8 local_550;
  uint local_548 [2];
  undefined4 uStack_540;
  undefined4 uStack_53c;
  uint *local_538;
  undefined8 local_530;
  uint local_528 [2];
  undefined4 uStack_520;
  undefined4 uStack_51c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  ProtocolReader reader;
  string out_file;
  string map_files;
  string format;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
  formats;
  KlassRegister klass_register;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_3a8 [56];
  string source;
  string output_path;
  uint *local_330;
  undefined8 local_328;
  uint local_320 [2];
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined2 local_310;
  uint *local_308;
  undefined8 local_300;
  uint local_2f8 [2];
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined2 local_2e8;
  uint *local_2e0;
  undefined8 local_2d8;
  uint local_2d0 [2];
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined2 local_2c0;
  uint *local_2b8;
  undefined8 local_2b0;
  uint local_2a8 [2];
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  undefined2 local_298;
  char *local_290;
  size_type local_288;
  char local_280 [8];
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined2 local_270;
  string local_268;
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  CommandLineParser parser;
  
  p_Var1 = &formats._M_t._M_impl.super__Rb_tree_header;
  formats._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  formats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  formats._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  formats._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  formats._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  init_supported_formats(&formats);
  std::__cxx11::string::string(local_108,"--",(allocator *)&reader);
  std::__cxx11::string::string(local_128,*argv,(allocator *)&klass_register);
  HawkTracer::ClientUtils::CommandLineParser::CommandLineParser(&parser,local_108,local_128);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::string(local_148,"format",(allocator *)&klass_register);
  supported_formats((string *)&reader,&formats);
  std::operator+(&local_518,"Output format. Supported formats: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader);
  local_290 = local_280;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p == &local_518.field_2) {
    uStack_278 = local_518.field_2._8_4_;
    uStack_274 = local_518.field_2._12_4_;
  }
  else {
    local_290 = local_518._M_dataplus._M_p;
  }
  local_288 = local_518._M_string_length;
  local_518._M_string_length = 0;
  local_518.field_2._M_allocated_capacity._0_4_ =
       local_518.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_270 = 0;
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  HawkTracer::ClientUtils::CommandLineParser::register_option(&parser,local_148);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::string(local_168,"output",(allocator *)&reader);
  std::__cxx11::string::string((string *)&local_538,"Output file",(allocator *)&klass_register);
  local_2b8 = local_2a8;
  if (local_538 == local_528) {
    uStack_2a0 = uStack_520;
    uStack_29c = uStack_51c;
  }
  else {
    local_2b8 = local_538;
  }
  local_2b0 = local_530;
  local_530 = 0;
  local_528[0] = local_528[0] & 0xffffff00;
  local_298 = 0;
  local_538 = local_528;
  HawkTracer::ClientUtils::CommandLineParser::register_option(&parser,local_168);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::string(local_188,"source",(allocator *)&reader);
  std::__cxx11::string::string
            ((string *)&local_558,"Data source description (either filename, or server address)",
             (allocator *)&klass_register);
  local_2d8 = local_550;
  local_2e0 = local_2d0;
  if (local_558 == local_548) {
    uStack_2c8 = uStack_540;
    uStack_2c4 = uStack_53c;
  }
  else {
    local_2e0 = local_558;
  }
  local_550 = 0;
  local_548[0] = local_548[0] & 0xffffff00;
  local_2c0 = 0x100;
  local_558 = local_548;
  HawkTracer::ClientUtils::CommandLineParser::register_option(&parser,local_188);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::string(local_1a8,"map",(allocator *)&reader);
  std::__cxx11::string::string
            ((string *)&local_578,"Comma-separated list of map files",(allocator *)&klass_register);
  local_308 = local_2f8;
  if (local_578 == local_568) {
    uStack_2f0 = uStack_560;
    uStack_2ec = uStack_55c;
  }
  else {
    local_308 = local_578;
  }
  local_300 = local_570;
  local_570 = 0;
  local_568[0] = local_568[0] & 0xffffff00;
  local_2e8 = 0;
  local_578 = local_568;
  HawkTracer::ClientUtils::CommandLineParser::register_option(&parser,local_1a8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::string(local_1c8,"help",(allocator *)&reader);
  std::__cxx11::string::string((string *)&local_598,"Print this help",(allocator *)&klass_register);
  local_328 = local_590;
  local_330 = local_320;
  if (local_598 == local_588) {
    uStack_318 = uStack_580;
    uStack_314 = uStack_57c;
  }
  else {
    local_330 = local_598;
  }
  local_590 = 0;
  local_588[0] = local_588[0] & 0xffffff00;
  local_310 = 1;
  local_598 = local_588;
  HawkTracer::ClientUtils::CommandLineParser::register_option(&parser,local_1c8);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string(local_1c8);
  cVar2 = HawkTracer::ClientUtils::CommandLineParser::parse((int)&parser,(char **)(ulong)(uint)argc)
  ;
  if (cVar2 != '\0') {
    std::__cxx11::string::string((string *)&reader,"help",(allocator *)&klass_register);
    cVar2 = HawkTracer::ClientUtils::CommandLineParser::has_value((string *)&parser);
    std::__cxx11::string::~string((string *)&reader);
    if (cVar2 == '\0') {
      std::__cxx11::string::string((string *)&reader,"format",(allocator *)&klass_register);
      std::__cxx11::string::string(local_1e8,"chrome-tracing",(allocator *)&output_path);
      HawkTracer::ClientUtils::CommandLineParser::get_value(&format,&parser,&reader,local_1e8);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string((string *)&reader);
      std::__cxx11::string::string((string *)&reader,"output",(allocator *)&klass_register);
      std::__cxx11::string::string
                (local_208,"hawktracer-trace-%d-%m-%Y-%H_%M_%S.httrace",(allocator *)&source);
      HawkTracer::ClientUtils::CommandLineParser::get_value(&output_path,&parser,&reader,local_208);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::string::~string((string *)&reader);
      std::__cxx11::string::string((string *)&reader,"source",(allocator *)&klass_register);
      std::__cxx11::string::string(local_228,"",(allocator *)&map_files);
      HawkTracer::ClientUtils::CommandLineParser::get_value(&source,&parser,&reader,local_228);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string((string *)&reader);
      std::__cxx11::string::string((string *)&reader,"map",(allocator *)&klass_register);
      std::__cxx11::string::string(local_248,"",(allocator *)&out_file);
      HawkTracer::ClientUtils::CommandLineParser::get_value(&map_files,&parser,&reader,local_248);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string((string *)&reader);
      HawkTracer::ClientUtils::make_stream_from_string((string *)&local_5b0);
      if (local_5b0 == (long *)0x0) {
        iVar7 = 1;
      }
      else {
        cVar2 = (**(code **)(*local_5b0 + 0x30))();
        HawkTracer::parser::KlassRegister::KlassRegister(&klass_register);
        local_5a8 = local_5b0;
        local_5b0 = (long *)0x0;
        iVar7 = 1;
        HawkTracer::parser::ProtocolReader::ProtocolReader(&reader,&klass_register,&local_5a8,1);
        if (local_5a8 != (long *)0x0) {
          (**(code **)(*local_5a8 + 8))();
        }
        local_5a8 = (long *)0x0;
        create_output_path_abi_cxx11_(&out_file,output_path._M_dataplus._M_p);
        converter._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
             ::find(&formats._M_t,&format);
        if ((_Rb_tree_header *)converter._M_node == p_Var1) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Unknown format: ");
          poVar6 = std::operator<<(poVar6,(string *)&format);
          poVar6 = std::operator<<(poVar6,". Supported formats are: ");
          supported_formats(&local_268,&formats);
          poVar6 = std::operator<<(poVar6,(string *)&local_268);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&local_268);
        }
        else {
          cVar3 = (**(code **)(**(long **)(converter._M_node + 2) + 0x10))
                            (*(long **)(converter._M_node + 2),&out_file);
          if (cVar3 == '\0') {
            pcVar8 = "Can\'t open output file";
          }
          else {
            local_e8._8_8_ = 0;
            local_e8._M_unused._M_object = &converter;
            local_d0 = std::
                       _Function_handler<void_(const_HawkTracer::parser::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/client/main.cpp:86:41)>
                       ::_M_invoke;
            local_d8 = std::
                       _Function_handler<void_(const_HawkTracer::parser::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/client/main.cpp:86:41)>
                       ::_M_manager;
            HawkTracer::parser::ProtocolReader::register_events_listener(&reader);
            std::_Function_base::~_Function_base((_Function_base *)&local_e8);
            if (map_files._M_string_length == 0) {
              poVar6 = std::operator<<((ostream *)&std::cerr,
                                       "map not specified... profiler will use numbers instead of human-readable names"
                                      );
              std::endl<char,std::char_traits<char>>(poVar6);
            }
            else {
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                       ::operator[](&formats,&format);
              bVar4 = HawkTracer::client::Converter::set_tracepoint_map
                                ((pmVar5->_M_t).
                                 super___uniq_ptr_impl<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_HawkTracer::client::Converter_*,_std::default_delete<HawkTracer::client::Converter>_>
                                 .super__Head_base<0UL,_HawkTracer::client::Converter_*,_false>.
                                 _M_head_impl,&map_files);
              if (!bVar4) {
                poVar6 = std::operator<<((ostream *)&std::cerr,"Map could not be set");
                std::endl<char,std::char_traits<char>>(poVar6);
              }
            }
            poVar6 = std::operator<<((ostream *)&std::cout,"Output will be written to a file: ");
            poVar6 = std::operator<<(poVar6,(string *)&out_file);
            std::endl<char,std::char_traits<char>>(poVar6);
            cVar3 = HawkTracer::parser::ProtocolReader::start();
            if (cVar3 != '\0') {
              if (cVar2 == '\0') {
                poVar6 = std::operator<<((ostream *)&std::cout,"Processing the file...");
                std::endl<char,std::char_traits<char>>(poVar6);
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cout,"Hit [Enter] to finish the trace...")
                ;
                std::endl<char,std::char_traits<char>>(poVar6);
                getchar();
                HawkTracer::parser::ProtocolReader::stop();
              }
              HawkTracer::parser::ProtocolReader::wait_for_complete();
              HawkTracer::parser::ProtocolReader::stop();
              iVar7 = 0;
              (**(code **)(**(long **)(converter._M_node + 2) + 0x20))();
              goto LAB_001112ec;
            }
            pcVar8 = "Error on starting the reader!!!";
          }
          poVar6 = std::operator<<((ostream *)&std::cerr,pcVar8);
          std::endl<char,std::char_traits<char>>(poVar6);
        }
LAB_001112ec:
        std::__cxx11::string::~string((string *)&out_file);
        HawkTracer::parser::ProtocolReader::~ProtocolReader(&reader);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(local_3a8);
        if (local_5b0 != (long *)0x0) {
          (**(code **)(*local_5b0 + 8))();
        }
      }
      std::__cxx11::string::~string((string *)&map_files);
      std::__cxx11::string::~string((string *)&source);
      std::__cxx11::string::~string((string *)&output_path);
      std::__cxx11::string::~string((string *)&format);
      goto LAB_00111357;
    }
  }
  HawkTracer::ClientUtils::CommandLineParser::print_help((ostream *)&parser);
  iVar7 = 1;
LAB_00111357:
  HawkTracer::ClientUtils::CommandLineParser::~CommandLineParser(&parser);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
  ::~_Rb_tree(&formats._M_t);
  return iVar7;
}

Assistant:

int main(int argc, char** argv)
{
    std::map<std::string, std::unique_ptr<client::Converter>> formats;

    init_supported_formats(formats);

    CommandLineParser parser("--", argv[0]);
    parser.register_option("format", CommandLineParser::OptionInfo(false, false, "Output format. Supported formats: " + supported_formats(formats)));
    parser.register_option("output", CommandLineParser::OptionInfo(false, false, "Output file"));
    parser.register_option("source", CommandLineParser::OptionInfo(false, true, "Data source description (either filename, or server address)"));
    parser.register_option("map", CommandLineParser::OptionInfo(false, false, "Comma-separated list of map files"));
    parser.register_option("help", CommandLineParser::OptionInfo(true, false, "Print this help"));

    if (!parser.parse(argc, argv) || parser.has_value("help"))
    {
        parser.print_help(std::cerr);
        return 1;
    }

    std::string format = parser.get_value("format", "chrome-tracing");
    std::string output_path = parser.get_value("output", "hawktracer-trace-%d-%m-%Y-%H_%M_%S.httrace");
    std::string source = parser.get_value("source", "");
    std::string map_files = parser.get_value("map", "");

    std::unique_ptr<parser::Stream> stream = ClientUtils::make_stream_from_string(source);
    if (!stream)
    {
        return 1;
    }

    bool is_stream_continuous = stream->is_continuous();

    parser::KlassRegister klass_register;
    parser::ProtocolReader reader(&klass_register, std::move(stream), true);
    std::string out_file = create_output_path(output_path.c_str());

    auto converter = formats.find(format);
    if (converter == formats.end())
    {
        std::cerr << "Unknown format: " << format << ". Supported formats are: " << supported_formats(formats) << std::endl;
        return 1;
    }
    if (converter->second->init(out_file))
    {
        reader.register_events_listener([&converter] (const parser::Event& event) { converter->second->process_event(event); });
    }
    else
    {
        std::cerr << "Can't open output file" << std::endl;
        return 1;
    }

    if (map_files.empty())
    {
        std::cerr << "map not specified... profiler will use numbers instead of human-readable names" << std::endl;
    }
    else
    {
        bool map_set = formats[format]->set_tracepoint_map(map_files);
        if (!map_set)
        {
            std::cerr << "Map could not be set" << std::endl;
        }
    }

    std::cout << "Output will be written to a file: " << out_file << std::endl;

    if (!reader.start())
    {
        std::cerr << "Error on starting the reader!!!" << std::endl;
        return 1;
    }

    if (is_stream_continuous)
    {
        std::cout << "Hit [Enter] to finish the trace..." << std::endl;
        getchar();
        reader.stop();
    }
    else
    {
        std::cout << "Processing the file..." << std::endl;
    }

    reader.wait_for_complete();
    reader.stop();
    converter->second->stop();

    return 0;
}